

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrecurse.c
# Opt level: O1

int notRecursiveDetectTest(char *filename,char *result,char *err,int options)

{
  undefined8 uVar1;
  long lVar2;
  
  nb_tests = nb_tests + 1;
  uVar1 = xmlNewParserCtxt();
  lVar2 = xmlCtxtReadFile(uVar1,filename,0,6);
  if (lVar2 == 0) {
    fprintf(_stderr,"Failed to parse correct file %s\n",filename);
  }
  else {
    xmlFreeDoc(lVar2);
  }
  xmlFreeParserCtxt(uVar1);
  return (uint)(lVar2 == 0);
}

Assistant:

static int
notRecursiveDetectTest(const char *filename,
             const char *result ATTRIBUTE_UNUSED,
             const char *err ATTRIBUTE_UNUSED,
	     int options ATTRIBUTE_UNUSED) {
    xmlDocPtr doc;
    xmlParserCtxtPtr ctxt;
    int res = 0;

    nb_tests++;

    ctxt = xmlNewParserCtxt();
    /*
     * base of the test, parse with the old API
     */
    doc = xmlCtxtReadFile(ctxt, filename, NULL,
                          XML_PARSE_NOENT | XML_PARSE_DTDLOAD);
    if (doc == NULL) {
        fprintf(stderr, "Failed to parse correct file %s\n", filename);
	xmlFreeParserCtxt(ctxt);
        return(1);
    }
    xmlFreeDoc(doc);
    xmlFreeParserCtxt(ctxt);

    return(res);
}